

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O2

string * __thiscall
Diligent::SPIRVShaderResources::DumpResources_abi_cxx11_
          (string *__return_storage_ptr__,SPIRVShaderResources *this)

{
  ushort uVar1;
  ushort uVar2;
  ostream *poVar3;
  SPIRVShaderResourceAttribs *pSVar4;
  Uint32 n;
  Uint32 UVar5;
  Uint32 n_1;
  uint uVar6;
  char *pcVar7;
  Uint32 ResNum;
  string msg;
  anon_class_16_2_2bfcf79f DumpResource;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_1a8,"Shader \'");
  poVar3 = std::operator<<(poVar3,this->m_ShaderName);
  poVar3 = std::operator<<(poVar3,"\' resource stats: total resources: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"UBs: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"; SBs: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"; Imgs: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"; Smpl Imgs: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"; ACs: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"; Sep Imgs: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"; Sep Smpls: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,'.');
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"Resources:");
  DumpResource.ResNum = &ResNum;
  ResNum = 0;
  DumpResource.ss = &ss;
  for (uVar6 = 0; uVar1 = this->m_StorageBufferOffset, uVar6 < uVar1; uVar6 = uVar6 + 1) {
    pSVar4 = GetUB(this,uVar6);
    if (pSVar4->Type != UniformBuffer) {
      FormatString<char[25]>(&msg,(char (*) [25])"Unexpected resource type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x36c);
      std::__cxx11::string::~string((string *)&msg);
    }
    poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," Uniform Buffer     ");
    DumpResources::anon_class_16_2_2bfcf79f::operator()(&DumpResource,pSVar4);
  }
  for (UVar5 = 0; uVar2 = this->m_StorageImageOffset, UVar5 < (uint)uVar2 - (uint)uVar1;
      UVar5 = UVar5 + 1) {
    pSVar4 = GetSB(this,UVar5);
    if (1 < (byte)(pSVar4->Type - ROStorageBuffer)) {
      FormatString<char[25]>(&msg,(char (*) [25])"Unexpected resource type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x375);
      std::__cxx11::string::~string((string *)&msg);
    }
    poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pcVar7 = " RW Storage Buffer  ";
    if (pSVar4->Type == ROStorageBuffer) {
      pcVar7 = " RO Storage Buffer  ";
    }
    std::operator<<(poVar3,pcVar7);
    DumpResources::anon_class_16_2_2bfcf79f::operator()(&DumpResource,pSVar4);
    uVar1 = this->m_StorageBufferOffset;
  }
  for (UVar5 = 0; uVar1 = this->m_SampledImageOffset, UVar5 < (uint)uVar1 - (uint)uVar2;
      UVar5 = UVar5 + 1) {
    pSVar4 = GetImg(this,UVar5);
    if (pSVar4->Type == StorageTexelBuffer) {
      poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      pcVar7 = " Storage Txl Buff ";
LAB_00321e00:
      std::operator<<(poVar3,pcVar7);
    }
    else {
      if (pSVar4->Type == StorageImage) {
        poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        pcVar7 = " Storage Image    ";
        goto LAB_00321e00;
      }
      FormatString<char[25]>(&msg,(char (*) [25])"Unexpected resource type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x388);
      std::__cxx11::string::~string((string *)&msg);
    }
    DumpResources::anon_class_16_2_2bfcf79f::operator()(&DumpResource,pSVar4);
    uVar2 = this->m_StorageImageOffset;
  }
  uVar6 = 0;
  do {
    uVar2 = this->m_AtomicCounterOffset;
    if ((uint)uVar2 - (uint)uVar1 <= uVar6) {
      for (UVar5 = 0; uVar1 = this->m_SeparateSamplerOffset, UVar5 < (uint)uVar1 - (uint)uVar2;
          UVar5 = UVar5 + 1) {
        pSVar4 = GetAC(this,UVar5);
        if (pSVar4->Type != AtomicCounter) {
          FormatString<char[25]>(&msg,(char (*) [25])"Unexpected resource type");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                     ,0x39d);
          std::__cxx11::string::~string((string *)&msg);
        }
        poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," Atomic Cntr      ");
        DumpResources::anon_class_16_2_2bfcf79f::operator()(&DumpResource,pSVar4);
        uVar2 = this->m_AtomicCounterOffset;
      }
      for (uVar6 = 0; uVar2 = this->m_SeparateImageOffset, uVar6 < (uint)uVar2 - (uint)uVar1;
          uVar6 = uVar6 + 1) {
        pSVar4 = GetSepSmplr(this,uVar6);
        if (pSVar4->Type != SeparateSampler) {
          FormatString<char[25]>(&msg,(char (*) [25])"Unexpected resource type");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                     ,0x3a4);
          std::__cxx11::string::~string((string *)&msg);
        }
        poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," Separate Smpl    ");
        DumpResources::anon_class_16_2_2bfcf79f::operator()(&DumpResource,pSVar4);
        uVar1 = this->m_SeparateSamplerOffset;
      }
      for (uVar6 = 0; uVar1 = this->m_InputAttachmentOffset, uVar6 < (uint)uVar1 - (uint)uVar2;
          uVar6 = uVar6 + 1) {
        pSVar4 = GetSepImg(this,uVar6);
        if (pSVar4->Type != SeparateImage) {
          FormatString<char[25]>(&msg,(char (*) [25])"Unexpected resource type");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                     ,0x3ab);
          std::__cxx11::string::~string((string *)&msg);
        }
        poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," Separate Img     ");
        DumpResources::anon_class_16_2_2bfcf79f::operator()(&DumpResource,pSVar4);
        uVar2 = this->m_SeparateImageOffset;
      }
      for (uVar6 = 0; uVar2 = this->m_AccelStructOffset, uVar6 < (uint)uVar2 - (uint)uVar1;
          uVar6 = uVar6 + 1) {
        pSVar4 = GetInptAtt(this,uVar6);
        if (pSVar4->Type != InputAttachment) {
          FormatString<char[25]>(&msg,(char (*) [25])"Unexpected resource type");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                     ,0x3b2);
          std::__cxx11::string::~string((string *)&msg);
        }
        poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," Input Attachment ");
        DumpResources::anon_class_16_2_2bfcf79f::operator()(&DumpResource,pSVar4);
        uVar1 = this->m_InputAttachmentOffset;
      }
      uVar6 = 0;
      while( true ) {
        uVar1 = this->m_TotalResources;
        if ((uint)uVar1 - (uint)uVar2 <= uVar6) break;
        pSVar4 = GetAccelStruct(this,uVar6);
        if (pSVar4->Type != AccelerationStructure) {
          FormatString<char[25]>(&msg,(char (*) [25])"Unexpected resource type");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                     ,0x3b9);
          std::__cxx11::string::~string((string *)&msg);
        }
        poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," Accel Struct     ");
        DumpResources::anon_class_16_2_2bfcf79f::operator()(&DumpResource,pSVar4);
        uVar6 = uVar6 + 1;
        uVar2 = this->m_AccelStructOffset;
      }
      if (ResNum != uVar1) {
        FormatString<char[26],char[30]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ResNum == GetTotalResources()",(char (*) [30])(ulong)uVar1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DumpResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x3bf);
        std::__cxx11::string::~string((string *)&msg);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return __return_storage_ptr__;
    }
    pSVar4 = GetSmpldImg(this,uVar6);
    if (pSVar4->Type == UniformTexelBuffer) {
      poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      pcVar7 = " Uniform Txl Buff ";
LAB_00321eef:
      std::operator<<(poVar3,pcVar7);
    }
    else {
      if (pSVar4->Type == SampledImage) {
        poVar3 = std::endl<char,std::char_traits<char>>(local_1a8);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        pcVar7 = " Sampled Image    ";
        goto LAB_00321eef;
      }
      FormatString<char[25]>(&msg,(char (*) [25])"Unexpected resource type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x398);
      std::__cxx11::string::~string((string *)&msg);
    }
    DumpResources::anon_class_16_2_2bfcf79f::operator()(&DumpResource,pSVar4);
    uVar6 = uVar6 + 1;
    uVar1 = this->m_SampledImageOffset;
  } while( true );
}

Assistant:

std::string SPIRVShaderResources::DumpResources() const
{
    std::stringstream ss;
    ss << "Shader '" << m_ShaderName << "' resource stats: total resources: " << GetTotalResources() << ":" << std::endl
       << "UBs: " << GetNumUBs() << "; SBs: " << GetNumSBs() << "; Imgs: " << GetNumImgs() << "; Smpl Imgs: " << GetNumSmpldImgs()
       << "; ACs: " << GetNumACs() << "; Sep Imgs: " << GetNumSepImgs() << "; Sep Smpls: " << GetNumSepSmplrs() << '.' << std::endl
       << "Resources:";

    Uint32 ResNum       = 0;
    auto   DumpResource = [&ss, &ResNum](const SPIRVShaderResourceAttribs& Res) {
        std::stringstream FullResNameSS;
        FullResNameSS << '\'' << Res.Name;
        if (Res.ArraySize > 1)
            FullResNameSS << '[' << Res.ArraySize << ']';
        FullResNameSS << '\'';
        ss << std::setw(32) << FullResNameSS.str();
        ++ResNum;
    };

    ProcessResources(
        [&](const SPIRVShaderResourceAttribs& UB, Uint32) //
        {
            VERIFY(UB.Type == SPIRVShaderResourceAttribs::ResourceType::UniformBuffer, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Uniform Buffer     ";
            DumpResource(UB);
        },
        [&](const SPIRVShaderResourceAttribs& SB, Uint32) //
        {
            VERIFY(SB.Type == SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer ||
                       SB.Type == SPIRVShaderResourceAttribs::ResourceType::RWStorageBuffer,
                   "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum
               << (SB.Type == SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer ? " RO Storage Buffer  " : " RW Storage Buffer  ");
            DumpResource(SB);
        },
        [&](const SPIRVShaderResourceAttribs& Img, Uint32) //
        {
            if (Img.Type == SPIRVShaderResourceAttribs::ResourceType::StorageImage)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Storage Image    ";
            }
            else if (Img.Type == SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Storage Txl Buff ";
            }
            else
                UNEXPECTED("Unexpected resource type");
            DumpResource(Img);
        },
        [&](const SPIRVShaderResourceAttribs& SmplImg, Uint32) //
        {
            if (SmplImg.Type == SPIRVShaderResourceAttribs::ResourceType::SampledImage)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Sampled Image    ";
            }
            else if (SmplImg.Type == SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Uniform Txl Buff ";
            }
            else
                UNEXPECTED("Unexpected resource type");
            DumpResource(SmplImg);
        },
        [&](const SPIRVShaderResourceAttribs& AC, Uint32) //
        {
            VERIFY(AC.Type == SPIRVShaderResourceAttribs::ResourceType::AtomicCounter, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Atomic Cntr      ";
            DumpResource(AC);
        },
        [&](const SPIRVShaderResourceAttribs& SepSmpl, Uint32) //
        {
            VERIFY(SepSmpl.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateSampler, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Separate Smpl    ";
            DumpResource(SepSmpl);
        },
        [&](const SPIRVShaderResourceAttribs& SepImg, Uint32) //
        {
            VERIFY(SepImg.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateImage, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Separate Img     ";
            DumpResource(SepImg);
        },
        [&](const SPIRVShaderResourceAttribs& InptAtt, Uint32) //
        {
            VERIFY(InptAtt.Type == SPIRVShaderResourceAttribs::ResourceType::InputAttachment, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Input Attachment ";
            DumpResource(InptAtt);
        },
        [&](const SPIRVShaderResourceAttribs& AccelStruct, Uint32) //
        {
            VERIFY(AccelStruct.Type == SPIRVShaderResourceAttribs::ResourceType::AccelerationStructure, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Accel Struct     ";
            DumpResource(AccelStruct);
        } //
    );
    VERIFY_EXPR(ResNum == GetTotalResources());

    return ss.str();
}